

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O1

void __thiscall irr::gui::CGUISkin::~CGUISkin(CGUISkin *this,void **vtt)

{
  long *plVar1;
  int *piVar2;
  _func_int **pp_Var3;
  IGUIFont *pIVar4;
  _func_int *p_Var5;
  IGUISpriteBank *pIVar6;
  long *plVar7;
  u32 i;
  long lVar8;
  
  pp_Var3 = (_func_int **)*vtt;
  (this->super_IGUISkin)._vptr_IGUISkin = pp_Var3;
  *(void **)((long)this->Sizes + (long)(pp_Var3[-3] + -0x6c)) = vtt[3];
  lVar8 = 0;
  do {
    pIVar4 = this->Fonts[lVar8];
    if (pIVar4 != (IGUIFont *)0x0) {
      p_Var5 = pIVar4->_vptr_IGUIFont[-3];
      piVar2 = (int *)(&pIVar4->field_0x10 + (long)p_Var5);
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        (**(code **)(*(long *)((long)&pIVar4->_vptr_IGUIFont + (long)p_Var5) + 8))();
      }
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  pIVar6 = this->SpriteBank;
  if (pIVar6 != (IGUISpriteBank *)0x0) {
    p_Var5 = pIVar6->_vptr_IGUISpriteBank[-3];
    piVar2 = (int *)(&pIVar6->field_0x10 + (long)p_Var5);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (**(code **)(*(long *)((long)&pIVar6->_vptr_IGUISpriteBank + (long)p_Var5) + 8))();
    }
  }
  lVar8 = 0x248;
  do {
    plVar1 = (long *)((long)this->Sizes + lVar8 + -0x6c);
    plVar7 = *(long **)((long)this->Sizes + lVar8 + -0x7c);
    if (plVar1 != plVar7) {
      operator_delete(plVar7,*plVar1 * 4 + 4);
    }
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != 0x148);
  return;
}

Assistant:

CGUISkin::~CGUISkin()
{
	for (u32 i = 0; i < EGDF_COUNT; ++i) {
		if (Fonts[i])
			Fonts[i]->drop();
	}

	if (SpriteBank)
		SpriteBank->drop();
}